

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_convert_tile_tint
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  int iVar1;
  long lVar2;
  
  if ((((zbitpix != 0x20) || (scale != 1.0)) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar1 = 0x19d;
  }
  else {
    *intlength = 4;
    if ((nullcheck == 1) && (iVar1 = *nullflagval, 0 < tilelen && iVar1 != nullval)) {
      lVar2 = tilelen + 1;
      do {
        if (*(int *)((long)tiledata + lVar2 * 4 + -8) == iVar1) {
          *(int *)((long)tiledata + lVar2 * 4 + -8) = nullval;
        }
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int imcomp_convert_tile_tint(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, do null value substitution. */
   
    int flagval, *idata;
    long ii;
    
 
        /* datatype of input array is int.  We only support writing this datatype
           to a FITS image with BITPIX = 32 and with BZERO = 0 and BSCALE = 1.  */

       if (zbitpix != LONG_IMG || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       idata = (int *) tiledata;
       *intlength = 4;

       if (nullcheck == 1) {
               /* no datatype conversion is required for any of the compression algorithms,
	         except possibly for HCOMPRESS (to I*8), which is handled later.
		 Just reset pixels equal to flagval to the FITS null value */
               flagval = *(int *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (idata[ii] == flagval)
		       idata[ii] = nullval;
                  }
               }
       }

       return(*status);
}